

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32(CodedInputStream *this,uint32_t *value)

{
  int64_t iVar1;
  int64_t result;
  uint32_t v;
  uint32_t *value_local;
  CodedInputStream *this_local;
  
  result._4_4_ = 0;
  if ((this->buffer_ < this->buffer_end_) &&
     (result._4_4_ = (uint)*this->buffer_, result._4_4_ < 0x80)) {
    *value = result._4_4_;
    Advance(this,1);
    this_local._7_1_ = true;
  }
  else {
    iVar1 = ReadVarint32Fallback(this,result._4_4_);
    *value = (uint32_t)iVar1;
    this_local._7_1_ = -1 < iVar1;
  }
  return this_local._7_1_;
}

Assistant:

inline bool CodedInputStream::ReadVarint32(uint32_t* value) {
  uint32_t v = 0;
  if (ABSL_PREDICT_TRUE(buffer_ < buffer_end_)) {
    v = *buffer_;
    if (v < 0x80) {
      *value = v;
      Advance(1);
      return true;
    }
  }
  int64_t result = ReadVarint32Fallback(v);
  *value = static_cast<uint32_t>(result);
  return result >= 0;
}